

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

void __thiscall
persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
::compute_higher_persistence
          (persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
           *this,unsigned_short min_dimension,unsigned_short max_dimension)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  pair<int,_int> pVar5;
  ostream *poVar6;
  ulong uVar7;
  undefined6 in_register_00000012;
  int dimension;
  undefined6 in_register_00000032;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  value_t vVar13;
  pivot_column_index_t pivot_column_index;
  
  uVar7 = CONCAT62(in_register_00000012,max_dimension) & 0xffffffff;
  uVar8 = CONCAT62(in_register_00000032,min_dimension) & 0xffffffff;
  uVar1 = 1;
  do {
    do {
      uVar4 = uVar1;
      if (uVar4 == uVar7 + 1) {
        return;
      }
      dimension = (int)uVar4;
      vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
      prepare_next_dimension(this->complex,dimension);
      uVar1 = uVar4 + 1;
      if (uVar1 == uVar8) {
        uVar2 = *(uint *)(*(long *)&(this->complex->binomial_coeff).B.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(int)this->complex->n]
                                    .super__Vector_base<int,_std::allocator<int>_> + 4 + uVar4 * 4);
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        lVar9 = 0;
        for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
          vVar13 = vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>
                   ::filtration(this->complex,dimension,(index_t)uVar12);
          pivot_column_index.
          super_unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ._M_h._M_buckets = (__buckets_ptr)((ulong)(uint)vVar13 + lVar9);
          std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::
          emplace_back<filtration_index_t>
                    (&this->columns_to_reduce,(filtration_index_t *)&pivot_column_index);
          lVar9 = lVar9 + 0x100000000;
        }
      }
    } while (uVar1 < uVar8);
    (*this->output->_vptr_output_t[5])(this->output,uVar4 & 0xffff);
    sort_columns(this);
    pivot_column_index.
    super_unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ._M_h._M_buckets =
         &pivot_column_index.
          super_unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ._M_h._M_single_bucket;
    pivot_column_index.
    super_unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ._M_h._M_bucket_count = 1;
    pivot_column_index.
    super_unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    pivot_column_index.
    super_unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ._M_h._M_element_count = 0;
    pivot_column_index.
    super_unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    pivot_column_index.
    super_unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    pivot_column_index.
    super_unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::__detail::
    _Rehash_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
    ::reserve((_Rehash_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
               *)&pivot_column_index,
              (long)*(int *)(*(long *)&(this->complex->binomial_coeff).B.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [(int)this->complex->n].
                                       super__Vector_base<int,_std::allocator<int>_> + 8 + uVar4 * 4
                            ));
    pVar5 = compute_pairs(this,dimension,&pivot_column_index,uVar8 <= uVar4);
    iVar11 = pVar5.second;
    if (uVar4 < uVar8) {
      if (((uVar4 == (int)CONCAT62(in_register_00000032,min_dimension) - 1) &&
          (this->print_betti_numbers_to_console == true)) &&
         (this->max_entries != 0xffffffffffffffff)) {
        poVar6 = std::operator<<((ostream *)&std::cout,"\x1b[K");
        poVar6 = std::operator<<(poVar6,"# Skipped columns in dimension ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6,": ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar11);
        goto LAB_00123500;
      }
    }
    else {
      iVar10 = pVar5.first;
      (*this->output->_vptr_output_t[9])(this->output,(long)iVar10,(long)pVar5 >> 0x20);
      iVar3 = -iVar10;
      if ((uVar4 & 1) == 0) {
        iVar3 = iVar10;
      }
      this->euler_characteristic = this->euler_characteristic + iVar3;
      if (this->print_betti_numbers_to_console == true) {
        poVar6 = std::operator<<((ostream *)&std::cout,"\x1b[K");
        poVar6 = std::operator<<(poVar6,"dim H_");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," = ");
        std::ostream::operator<<(poVar6,iVar10);
        poVar6 = (ostream *)&std::cout;
        if (iVar11 != 0 && -1 < (long)pVar5) {
          poVar6 = std::operator<<((ostream *)&std::cout," (skipped ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar11);
          std::operator<<(poVar6,")");
          poVar6 = (ostream *)&std::cout;
        }
LAB_00123500:
        std::endl<char,std::char_traits<char>>(poVar6);
      }
    }
    if (uVar4 < uVar7) {
      assemble_columns_to_reduce(this,dimension,&pivot_column_index);
    }
    if ((int)(uint)this->complex->max_dimension <= this->complex->current_dimension) {
      (*this->output->_vptr_output_t[10])();
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&pivot_column_index);
      return;
    }
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&pivot_column_index);
  } while( true );
}

Assistant:

void compute_higher_persistence(unsigned short min_dimension, unsigned short max_dimension) {
		for (auto dimension = 1u; dimension <= max_dimension; ++dimension) {
			complex.prepare_next_dimension(dimension);

			if (dimension + 1 == min_dimension) {
				// Here we need to reduce *all* cells because we did not compute anything of smaller dimension
				index_t number_of_cells = index_t(complex.number_of_cells(dimension));
				for (index_t index = 0; index < number_of_cells; index++) {
					columns_to_reduce.push_back(std::make_pair(complex.filtration(dimension, index), index));
				}
			}

			if (dimension + 1 < min_dimension) continue;

			output->computing_barcodes_in_dimension(dimension);

			sort_columns();

#ifdef INDICATE_PROGRESS
			std::cout << "\033[K"
			          << "computing persistent homology in dimension " << dimension << std::flush << "\r";
#endif
#ifdef USE_ARRAY_HASHMAP
			pivot_column_index_t pivot_column_index(complex.number_of_cells(dimension + 1), INVALID_INDEX);
#else
			pivot_column_index_t pivot_column_index;
			pivot_column_index.reserve(complex.number_of_cells(dimension + 1));
#endif

			auto betti = compute_pairs(dimension, pivot_column_index, dimension >= min_dimension);
			if (dimension >= min_dimension) {
				complex.computation_result(dimension, betti.first, betti.second);
#ifdef RETRIEVE_PERSISTENCE
				betti_numbers.push_back(betti.first);
#endif
				output->betti_number(betti.first, betti.second);
				euler_characteristic += (dimension & 1 ? -1 : 1) * betti.first;

				if (print_betti_numbers_to_console) {
					std::cout << "\033[K"
					          << "dim H_" << dimension << " = " << betti.first;
					if (betti.second > 0) { std::cout << " (skipped " << betti.second << ")"; }
					std::cout << std::endl;
				}
			} else if (int(dimension) == min_dimension - 1 && print_betti_numbers_to_console &&
			           max_entries < std::numeric_limits<size_t>::max()) {
				std::cout << "\033[K"
				          << "# Skipped columns in dimension " << dimension << ": " << betti.second << std::endl;
			}
			if (dimension < max_dimension) assemble_columns_to_reduce(dimension, pivot_column_index);

			// Stop early
			if (complex.is_top_dimension()) {
				output->remaining_homology_is_trivial();
				break;
			}
		}
	}